

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fltnode.c
# Opt level: O2

int callback(void *sys,void *user)

{
  size_t sVar1;
  prf_nodeinfo_t *ppVar2;
  long lVar3;
  
  sVar1 = bf_get_position((bfile_t *)user);
  if ((long)sVar1 <= position) {
    return 1;
  }
  ppVar2 = prf_nodeinfo_get(*sys);
  printf("enclosing node: \"%s\" (opcode=%d)\n",ppVar2->name,(ulong)ppVar2->opcode);
  lVar3 = (long)(int)((int)sVar1 - (uint)*(ushort *)((long)sys + 2));
  printf("    position: %d (+%ld) [node size %d]\n",lVar3,position - lVar3);
  exit(0);
}

Assistant:

int
callback(
  void * sys,
  void * user )
{
  prf_node_t * node;
  prf_nodeinfo_t * info;
  bfile_t * file;
  long fpos;

  node = (prf_node_t *) sys;
  file = (bfile_t *) user;

  fpos = bf_get_position( file );
  if ( fpos > position ) {
    int pos;
    info = prf_nodeinfo_get( node->opcode );
    assert( info != NULL );
    printf( "enclosing node: \"%s\" (opcode=%d)\n", info->name,
       info->opcode );
    pos = fpos - node->length;
    printf( "    position: %d (+%ld) [node size %d]\n",
        pos, position - pos, node->length );
    exit( 0 ); /* model load can't be broken with PRF_TRAV_EXIT */
  }
  return PRF_TRAV_CONTINUE;
}